

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cCommonBugsTests.cpp
# Opt level: O3

string * __thiscall
gl3cts::InvalidVSInputsTest::getShaderBody_abi_cxx11_
          (string *__return_storage_ptr__,InvalidVSInputsTest *this,_test_iteration iteration)

{
  size_t sVar1;
  TestError *this_00;
  char *pcVar2;
  char *pcVar3;
  stringstream body_sstream;
  long *local_1d0 [2];
  long local_1c0 [2];
  stringstream local_1b0 [16];
  undefined1 local_1a0 [376];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  switch(iteration) {
  case TEST_ITERATION_FIRST:
  case TEST_ITERATION_INVALID_BVEC2_INPUT:
  case TEST_ITERATION_INVALID_BVEC3_INPUT:
  case TEST_ITERATION_INVALID_BVEC4_INPUT:
    std::__cxx11::stringstream::stringstream(local_1b0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a0,"#version 140\n\nin ",0x11);
    pcVar2 = "mix_vec4_bvec4";
    if (iteration == TEST_ITERATION_INVALID_BVEC3_INPUT) {
      pcVar2 = "mix_vec3_bvec3";
    }
    pcVar3 = "mix_vec2_bvec2";
    if (iteration != TEST_ITERATION_INVALID_BVEC2_INPUT) {
      pcVar3 = pcVar2;
    }
    pcVar2 = "bool";
    if (iteration != TEST_ITERATION_FIRST) {
      pcVar2 = pcVar3 + 9;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a0,pcVar2,(ulong)(iteration == TEST_ITERATION_FIRST) ^ 5);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a0," data;\n\nvoid main()\n{\n}\n",0x18);
    std::__cxx11::stringbuf::str();
    break;
  case TEST_ITERATION_INVALID_CENTROID_QUALIFIED_INPUT:
  case TEST_ITERATION_INVALID_PATCH_QUALIFIED_INPUT:
  case TEST_ITERATION_INVALID_SAMPLE_QUALIFIED_INPUT:
    std::__cxx11::stringstream::stringstream(local_1b0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"#version 140\n\n",0xe);
    pcVar2 = "sample";
    if (iteration == TEST_ITERATION_INVALID_PATCH_QUALIFIED_INPUT) {
      pcVar2 = "patch";
    }
    pcVar3 = "centroid";
    if (iteration != TEST_ITERATION_INVALID_CENTROID_QUALIFIED_INPUT) {
      pcVar3 = pcVar2;
    }
    sVar1 = strlen(pcVar3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,pcVar3,sVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a0," in vec4 data;\n\nvoid main()\n{\n}\n",0x20);
    std::__cxx11::stringbuf::str();
    break;
  case TEST_ITERATION_INVALID_OPAQUE_TYPE_INPUT:
    pcVar2 = "#version 140\n\nin sampler2D data;\n\nvoid main()\n{\n}\n";
    goto LAB_00a7faec;
  case TEST_ITERATION_INVALID_STRUCTURE_INPUT:
    pcVar2 = "#version 140\n\nin struct\n{\n    vec4 test;\n} data;\n\nvoid main()\n{\n}\n";
LAB_00a7faec:
    std::__cxx11::string::_M_replace((ulong)__return_storage_ptr__,0,(char *)0x0,(ulong)pcVar2);
    return __return_storage_ptr__;
  default:
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Unrecognized test iteration type",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCommonBugsTests.cpp"
               ,0x56b);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_1d0);
  if (local_1d0[0] != local_1c0) {
    operator_delete(local_1d0[0],local_1c0[0] + 1);
  }
  std::__cxx11::stringstream::~stringstream(local_1b0);
  std::ios_base::~ios_base((ios_base *)(local_1a0 + 0x70));
  return __return_storage_ptr__;
}

Assistant:

std::string InvalidVSInputsTest::getShaderBody(_test_iteration iteration) const
{
	std::string result;

	switch (iteration)
	{
	case TEST_ITERATION_INVALID_BOOL_INPUT:
	case TEST_ITERATION_INVALID_BVEC2_INPUT:
	case TEST_ITERATION_INVALID_BVEC3_INPUT:
	case TEST_ITERATION_INVALID_BVEC4_INPUT:
	{
		std::stringstream body_sstream;
		const char*		  type = (iteration == TEST_ITERATION_INVALID_BOOL_INPUT) ?
							   "bool" :
							   (iteration == TEST_ITERATION_INVALID_BVEC2_INPUT) ?
							   "bvec2" :
							   (iteration == TEST_ITERATION_INVALID_BVEC3_INPUT) ? "bvec3" : "bvec4";

		body_sstream << "#version 140\n"
						"\n"
						"in "
					 << type << " data;\n"
								"\n"
								"void main()\n"
								"{\n"
								"}\n";

		result = body_sstream.str();
		break;
	}

	case TEST_ITERATION_INVALID_OPAQUE_TYPE_INPUT:
	{
		result = "#version 140\n"
				 "\n"
				 "in sampler2D data;\n"
				 "\n"
				 "void main()\n"
				 "{\n"
				 "}\n";

		break;
	}

	case TEST_ITERATION_INVALID_STRUCTURE_INPUT:
	{
		result = "#version 140\n"
				 "\n"
				 "in struct\n"
				 "{\n"
				 "    vec4 test;\n"
				 "} data;\n"
				 "\n"
				 "void main()\n"
				 "{\n"
				 "}\n";

		break;
	}

	case TEST_ITERATION_INVALID_CENTROID_QUALIFIED_INPUT:
	case TEST_ITERATION_INVALID_PATCH_QUALIFIED_INPUT:
	case TEST_ITERATION_INVALID_SAMPLE_QUALIFIED_INPUT:
	{
		std::stringstream body_sstream;
		const char*		  qualifier = (iteration == TEST_ITERATION_INVALID_CENTROID_QUALIFIED_INPUT) ?
									"centroid" :
									(iteration == TEST_ITERATION_INVALID_PATCH_QUALIFIED_INPUT) ? "patch" : "sample";

		body_sstream << "#version 140\n"
						"\n"
					 << qualifier << " in vec4 data;\n"
									 "\n"
									 "void main()\n"
									 "{\n"
									 "}\n";

		result = body_sstream.str();
		break;
	}

	default:
		TCU_FAIL("Unrecognized test iteration type");
	} /* switch (iteration) */

	return result;
}